

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void get_header(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
               cio_read_buffer *buffer,size_t num_bytes)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  ushort uVar4;
  uint uVar5;
  cio_error err_00;
  ushort uVar6;
  char *reason;
  cio_websocket_status_code status_code;
  byte bVar7;
  
  _Var3 = handled_read_error((cio_websocket *)handler_context,err);
  if (_Var3) {
    return;
  }
  bVar1 = *buffer->fetch_ptr;
  buffer->fetch_ptr = buffer->fetch_ptr + num_bytes;
  bVar2 = bVar1 >> 7;
  uVar5 = *(uint *)((long)handler_context + 0x10);
  uVar6 = (ushort)uVar5;
  *(ushort *)((long)handler_context + 0x10) = uVar6 & 0xfffe | (ushort)bVar2;
  if ((bVar1 & 0x70) == 0) {
    uVar4 = bVar1 & 0xf;
    bVar7 = (byte)uVar4;
    if ((char)bVar1 < '\0' || bVar7 < 8) {
      if ((char)bVar1 < '\0') {
        if (bVar7 == 0) {
          uVar5 = (uVar5 & 0xffff) >> 5;
          if ((uVar5 & 0xf) == 0) goto LAB_00103d53;
          uVar6 = (uVar6 & 0xfe00 | (ushort)bVar2) + ((ushort)uVar5 & 0xf) * 2;
        }
        else {
          if (bVar7 < 8 && (uVar5 & 0x1e0) != 0) goto LAB_00103d4a;
          uVar6 = uVar6 & 0xffe0 | (ushort)bVar2 | (ushort)(byte)(bVar1 * '\x02');
        }
LAB_00103ce0:
        *(ushort *)((long)handler_context + 0x10) = uVar6;
        err_00 = cio_buffered_stream_read_at_least
                           (buffered_stream,buffer,1,get_first_length,handler_context);
        if (err_00 == CIO_SUCCESS) {
          return;
        }
        reason = "error while start reading websocket frame length";
        status_code = CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR;
        goto LAB_00103d65;
      }
      if (bVar7 == 0) {
        uVar5 = (uVar5 & 0xffff) >> 5;
        uVar4 = (ushort)uVar5 & 0xf;
        if ((uVar5 & 0xf) != 0) {
          uVar6 = uVar6 & 0xffe0;
          goto LAB_00103cdd;
        }
LAB_00103d53:
        reason = "got continuation frame without correct start frame";
      }
      else {
        if ((uVar5 & 0x1e0) == 0) {
          uVar6 = uVar6 & 0xfe00 | uVar4 << 5;
LAB_00103cdd:
          uVar6 = uVar6 + uVar4 * 2;
          goto LAB_00103ce0;
        }
LAB_00103d4a:
        reason = "got non-continuation frame within fragmented stream";
      }
    }
    else {
      reason = "got fragmented control frame";
    }
  }
  else {
    reason = "reserved bit set in frame";
  }
  err_00 = CIO_PROTOCOL_NOT_SUPPORTED;
  status_code = CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR;
LAB_00103d65:
  handle_error((cio_websocket *)handler_context,err_00,status_code,reason);
  return;
}

Assistant:

static void get_header(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	(void)num_bytes;
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);
	uint8_t field = *ptr;
	cio_read_buffer_consume(buffer, num_bytes);

	websocket->ws_private.ws_flags.fin = (field & WS_HEADER_FIN) == WS_HEADER_FIN;

	uint8_t rsv_field = field & RSV_MASK;
	if (cio_unlikely(rsv_field != 0)) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "reserved bit set in frame");
		return;
	}

	const char *err_msg = handle_fin(websocket, field);
	if (cio_unlikely(err_msg != NULL)) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, err_msg);
		return;
	}

	err = cio_buffered_stream_read_at_least(buffered_stream, buffer, 1, get_first_length, websocket);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while start reading websocket frame length");
	}
}